

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O0

void Nwk_ManUpdateLevel(Nwk_Obj_t *pObj)

{
  Tim_Man_t *p;
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  Nwk_Obj_t *pObj_00;
  bool bVar3;
  int nTerms;
  int iTerm1;
  int iBox;
  int k;
  int iCur;
  int LevelNew;
  Nwk_Obj_t *pNext;
  Nwk_Obj_t *pTemp;
  Vec_Ptr_t *vQueue;
  Tim_Man_t *pManTime;
  Nwk_Obj_t *pObj_local;
  
  p = pObj->pMan->pManTime;
  p_00 = pObj->pMan->vTemp;
  _iCur = (Nwk_Obj_t *)0x0;
  iVar1 = Nwk_ObjIsNode(pObj);
  if (iVar1 != 0) {
    Vec_PtrClear(p_00);
    Vec_PtrPush(p_00,pObj);
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 & 0xffffffef | 0x10;
    for (iBox = 0; iVar1 = Vec_PtrSize(p_00), iBox < iVar1; iBox = iBox + 1) {
      pObj_00 = (Nwk_Obj_t *)Vec_PtrEntry(p_00,iBox);
      *(uint *)&pObj_00->field_0x20 = *(uint *)&pObj_00->field_0x20 & 0xffffffef;
      iVar1 = Nwk_ObjLevelNew(pObj_00);
      iVar2 = Nwk_ObjLevel(pObj_00);
      if (iVar1 != iVar2) {
        Nwk_ObjSetLevel(pObj_00,iVar1);
        iVar1 = Nwk_ObjIsCo(pObj_00);
        if (iVar1 == 0) {
          iTerm1 = 0;
          while( true ) {
            bVar3 = false;
            if (iTerm1 < pObj_00->nFanouts) {
              _iCur = pObj_00->pFanio[pObj_00->nFanins + iTerm1];
              bVar3 = _iCur != (Nwk_Obj_t *)0x0;
            }
            if (!bVar3) break;
            if ((*(uint *)&_iCur->field_0x20 >> 4 & 1) == 0) {
              Nwk_NodeUpdateAddToQueue(p_00,_iCur,iBox,1);
              *(uint *)&_iCur->field_0x20 = *(uint *)&_iCur->field_0x20 & 0xffffffef | 0x10;
            }
            iTerm1 = iTerm1 + 1;
          }
        }
        else if ((p != (Tim_Man_t *)0x0) &&
                (iVar1 = Tim_ManBoxForCo(p,*(uint *)&pObj_00->field_0x20 >> 7), -1 < iVar1)) {
          Tim_ManSetCurrentTravIdBoxInputs(p,iVar1);
          iVar2 = Tim_ManBoxOutputFirst(p,iVar1);
          iVar1 = Tim_ManBoxOutputNum(p,iVar1);
          for (iTerm1 = 0; iTerm1 < iVar1; iTerm1 = iTerm1 + 1) {
            _iCur = Nwk_ManCi(_iCur->pMan,iVar2 + iTerm1);
            if ((*(uint *)&_iCur->field_0x20 >> 4 & 1) == 0) {
              Nwk_NodeUpdateAddToQueue(p_00,_iCur,iBox,1);
              *(uint *)&_iCur->field_0x20 = *(uint *)&_iCur->field_0x20 & 0xffffffef | 0x10;
            }
          }
        }
      }
    }
    return;
  }
  __assert_fail("Nwk_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                ,0x305,"void Nwk_ManUpdateLevel(Nwk_Obj_t *)");
}

Assistant:

void Nwk_ManUpdateLevel( Nwk_Obj_t * pObj )
{
    Tim_Man_t * pManTime = pObj->pMan->pManTime;
    Vec_Ptr_t * vQueue = pObj->pMan->vTemp;
    Nwk_Obj_t * pTemp;
    Nwk_Obj_t * pNext = NULL; // Suppress "might be used uninitialized"
    int LevelNew, iCur, k, iBox, iTerm1, nTerms;
    assert( Nwk_ObjIsNode(pObj) );
    // initialize the queue with the node
    Vec_PtrClear( vQueue );
    Vec_PtrPush( vQueue, pObj );
    pObj->MarkA = 1;
    // process objects
    Vec_PtrForEachEntry( Nwk_Obj_t *, vQueue, pTemp, iCur )
    {
        pTemp->MarkA = 0;
        LevelNew = Nwk_ObjLevelNew( pTemp );
        if ( LevelNew == Nwk_ObjLevel(pTemp) )
            continue;
        Nwk_ObjSetLevel( pTemp, LevelNew );
        // add the fanouts to the queue
        if ( Nwk_ObjIsCo(pTemp) )
        {
            if ( pManTime )
            {
                iBox = Tim_ManBoxForCo( pManTime, pTemp->PioId );
                if ( iBox >= 0 ) // this is not a true PO
                {
                    Tim_ManSetCurrentTravIdBoxInputs( pManTime, iBox );
                    iTerm1 = Tim_ManBoxOutputFirst( pManTime, iBox );
                    nTerms = Tim_ManBoxOutputNum( pManTime, iBox );
                    for ( k = 0; k < nTerms; k++ )
                    {
                        pNext = Nwk_ManCi(pNext->pMan, iTerm1 + k);
                        if ( pNext->MarkA )
                            continue;
                        Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 1 );
                        pNext->MarkA = 1;
                    }
                }
            }
        }
        else
        {
            Nwk_ObjForEachFanout( pTemp, pNext, k )
            {
                if ( pNext->MarkA )
                    continue;
                Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 1 );
                pNext->MarkA = 1;
            }
        }
    }
}